

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_root.cpp
# Opt level: O0

error_code __thiscall anon_unknown.dwarf_5d74e::root_object::key(root_object *this,string *key)

{
  bool bVar1;
  error_code eVar2;
  reference local_58;
  reference local_48;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *key_local;
  root_object *this_local;
  error_category *local_10;
  
  local_28 = key;
  key_local = (string *)this;
  bVar1 = std::operator==(key,"version");
  if (bVar1) {
    std::bitset<3UL>::operator[]((bitset<3UL> *)&local_38,(size_t)&this->seen_);
    std::bitset<3UL>::reference::operator=(&local_38,true);
    std::bitset<3UL>::reference::~reference(&local_38);
    eVar2 = pstore::exchange::import_ns::rule::
            push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                      (&this->super_rule,&this->version_);
    local_10 = eVar2._M_cat;
    this_local._0_4_ = eVar2._M_value;
  }
  else {
    bVar1 = std::operator==(local_28,"id");
    if (bVar1) {
      std::bitset<3UL>::operator[]((bitset<3UL> *)&local_48,(size_t)&this->seen_);
      std::bitset<3UL>::reference::operator=(&local_48,true);
      std::bitset<3UL>::reference::~reference(&local_48);
      eVar2 = pstore::exchange::import_ns::rule::
              push<pstore::exchange::import_ns::uuid_rule,pstore::uuid*>
                        (&this->super_rule,&this->id_);
      local_10 = eVar2._M_cat;
      this_local._0_4_ = eVar2._M_value;
    }
    else {
      bVar1 = std::operator==(local_28,"transactions");
      if (bVar1) {
        std::bitset<3UL>::operator[]((bitset<3UL> *)&local_58,(size_t)&this->seen_);
        std::bitset<3UL>::reference::operator=(&local_58,true);
        std::bitset<3UL>::reference::~reference(&local_58);
        eVar2 = pstore::exchange::import_ns::rule::
                push<pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>>,pstore::exchange::import_ns::string_mapping*,pstore::exchange::import_ns::string_mapping*>
                          (&this->super_rule,&this->names_,&this->paths_);
        local_10 = eVar2._M_cat;
        this_local._0_4_ = eVar2._M_value;
      }
      else {
        std::error_code::error_code<pstore::exchange::import_ns::error,void>
                  ((error_code *)&this_local,unrecognized_root_key);
      }
    }
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code root_object::key (std::string const & key) {
        using pstore::exchange::import_ns::error;
        using pstore::exchange::import_ns::transaction_array;
        using pstore::exchange::import_ns::uint64_rule;
        using pstore::exchange::import_ns::uuid_rule;

        // TODO: check that 'version' is the first key that we see.
        if (key == "version") {
            seen_[version] = true;
            return push<uint64_rule> (&version_);
        }
        if (key == "id") {
            seen_[id] = true;
            return push<uuid_rule> (&id_);
        }
        if (key == "transactions") {
            seen_[transactions] = true;
            return push<transaction_array<pstore::transaction_lock>> (&names_, &paths_);
        }
        return error::unrecognized_root_key;
    }